

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen.c
# Opt level: O1

void screen_byte_4(ubyte iobyte,uint address)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ushort i;
  ushort uVar4;
  undefined7 in_register_00000039;
  ulong uVar5;
  uint i1;
  uint i1_00;
  
  uVar2 = (ushort)(address - ram_screen_start) ^ 0xffff8000;
  if (screen_start <= address) {
    uVar2 = (uint)address;
  }
  uVar2 = uVar2 - screen_start;
  i1 = (uint)CONCAT71(in_register_00000039,iobyte) & 0xffffffaa;
  if ((int)i1 < 0x80) {
    if ((int)i1 < 0x20) {
      if ((int)i1 < 8) {
        if ((CONCAT71(in_register_00000039,iobyte) & 0xffffffaa) != 0) {
          i1 = 1;
        }
      }
      else if (i1 == 8) {
        i1 = 2;
      }
      else {
        i1 = 3;
      }
    }
    else if ((int)i1 < 0x28) {
      if (i1 == 0x20) {
        i1 = 4;
      }
      else {
        i1 = 5;
      }
    }
    else if (i1 == 0x28) {
      i1 = 6;
    }
    else {
      i1 = 7;
    }
  }
  else if ((int)i1 < 0xa0) {
    if ((int)i1 < 0x88) {
      if (i1 == 0x80) {
        i1 = 8;
      }
      else {
        i1 = 9;
      }
    }
    else if (i1 == 0x88) {
      i1 = 10;
    }
    else {
      i1 = 0xb;
    }
  }
  else if ((int)i1 < 0xa8) {
    if (i1 == 0xa0) {
      i1 = 0xc;
    }
    else {
      i1 = 0xd;
    }
  }
  else if (i1 == 0xa8) {
    i1 = 0xe;
  }
  else {
    i1 = 0xf;
  }
  uVar5 = CONCAT71(in_register_00000039,iobyte) & 0xffffffffffffff55;
  i1_00 = iobyte & 0x55;
  if (i1_00 < 0x40) {
    switch(i1_00) {
    case 0:
      break;
    case 1:
      i1_00 = 1;
      break;
    case 2:
    case 3:
update_graphics_screen:
      if (colour_bits == '\x04') {
        getimage(0,10,0x27f,0x60,pic_temp_ram);
        putimage(0,0,pic_temp_ram,0);
        getimage(0,0x61,0x27f,0xb8,pic_temp_ram);
        putimage(0,0x57,pic_temp_ram,0);
        getimage(0,0xb9,0x27f,0x10f,pic_temp_ram);
        putimage(0,0xaf,pic_temp_ram,0);
        getimage(0,0x110,0x27f,0x15e,pic_temp_ram);
        putimage(0,0x106,pic_temp_ram,0);
        return;
      }
      if (colour_bits == '\x02') {
        getimage(0,10,0x27f,0x60,pic_temp_ram);
        putimage(0,0,pic_temp_ram,0);
        getimage(0,0x61,0x27f,0xb8,pic_temp_ram);
        putimage(0,0x57,pic_temp_ram,0);
        getimage(0,0xb9,0x27f,0x10f,pic_temp_ram);
        putimage(0,0xaf,pic_temp_ram,0);
        getimage(0,0x110,0x27f,0x15e,pic_temp_ram);
        putimage(0,0x106,pic_temp_ram,0);
        return;
      }
      if (colour_bits != '\x01') {
        puts("Error, unknown number of colours");
        exit(1);
      }
      mono_update();
      return;
    case 4:
      i1_00 = 2;
      break;
    case 5:
      i1_00 = 3;
      break;
    default:
      (*(code *)(&DAT_0010de2c + *(int *)(&DAT_0010de2c + (ulong)(i1_00 - 0x10) * 4)))
                (uVar5,&DAT_0010de2c + *(int *)(&DAT_0010de2c + (ulong)(i1_00 - 0x10) * 4));
      return;
    }
  }
  else {
    switch(i1_00) {
    case 0x40:
      i1_00 = 8;
      break;
    case 0x41:
      i1_00 = 9;
      break;
    case 0x42:
    case 0x43:
      goto update_graphics_screen;
    case 0x44:
      i1_00 = 10;
      break;
    case 0x45:
      i1_00 = 0xb;
      break;
    default:
      (*(code *)(&DAT_0010de5c + *(int *)(&DAT_0010de5c + (ulong)(i1_00 - 0x50) * 4)))
                (uVar5,&DAT_0010de5c + *(int *)(&DAT_0010de5c + (ulong)(i1_00 - 0x50) * 4));
      return;
    }
  }
  uVar1 = (uVar2 & 7) + ((uint)(((ulong)uVar2 & 0xffff) / ((ulong)crt_regs[1] << 3)) & 0x1fff) * 8;
  uVar3 = (short)(uVar1 >> 2) + (short)uVar1;
  uVar4 = (ushort)(((ulong)uVar2 & 0xffff) % ((ulong)crt_regs[1] << 3));
  i = uVar4 & 0x7f8;
  putpixel(i,uVar3,i1);
  putpixel(i + 1,uVar3,i1);
  putpixel(i + 2,uVar3,i1);
  putpixel(i + 3,uVar3,i1);
  putpixel(i + 4,uVar3,i1_00);
  putpixel(i + 5,uVar3,i1_00);
  putpixel(i | 6,uVar3,i1_00);
  uVar4 = uVar4 | 7;
  putpixel(uVar4,uVar3,i1_00);
  if ((uVar2 & 3) == 0) {
    uVar3 = uVar3 - 1;
    putpixel(i,uVar3,i1);
    putpixel(i + 1,uVar3,i1);
    putpixel(i + 2,uVar3,i1);
    putpixel(i + 3,uVar3,i1);
    putpixel(i + 4,uVar3,i1_00);
    putpixel(i + 5,uVar3,i1_00);
    putpixel(i | 6,uVar3,i1_00);
    putpixel(uVar4,uVar3,i1_00);
    return;
  }
  return;
}

Assistant:

void screen_byte_4(ubyte iobyte, uint address) {
    uint x_cord = 0;                       // general x coordinate
    uint y_cord = 0;                       // general y coordinate
    uint virt_y_cord = 0;                  // scaled pc y coordinate
    uint bitsperline;                    // bits per scaline

    ubyte colpix1;                       // holds the colour of pixel 1
    ubyte colpix2;                       // holds the colour of pixel 2

    bitsperline = 8 * crt_regs[1];           // calculate bits per line

    // deal with hardware wraparound
    if (address < screen_start) address += (0x8000 - ram_screen_start);
    address -= screen_start;
    y_cord = address / bitsperline;          // calculate the character row
    y_cord *= 8;                           // convert to the pixel row
    y_cord += (address % 8);                 // add fraction of character offset
    virt_y_cord += y_cord + y_cord / 4;        // scale output to fit screen


    x_cord = address % bitsperline;          // calcalate the character column
    x_cord &= 0xFFF8;                      // mask off the lower 3 bits

    switch (iobyte & 0xAA)                         // calculate the colour of pixel 1
    {
        case 0x00:
            colpix1 = 0x0;
            break;
        case 0x02:
            colpix1 = 0x1;
            break;
        case 0x08:
            colpix1 = 0x2;
            break;
        case 0x0A:
            colpix1 = 0x3;
            break;
        case 0x20:
            colpix1 = 0x4;
            break;
        case 0x22:
            colpix1 = 0x5;
            break;
        case 0x28:
            colpix1 = 0x6;
            break;
        case 0x2A:
            colpix1 = 0x7;
            break;
        case 0x80:
            colpix1 = 0x8;
            break;
        case 0x82:
            colpix1 = 0x9;
            break;
        case 0x88:
            colpix1 = 0xA;
            break;
        case 0x8A:
            colpix1 = 0xB;
            break;
        case 0xA0:
            colpix1 = 0xC;
            break;
        case 0xA2:
            colpix1 = 0xD;
            break;
        case 0xA8:
            colpix1 = 0xE;
            break;
        case 0xAA:
            colpix1 = 0xF;
            break;
    }

    switch (iobyte & 0x55)                 // calculate the colour of pixel 2
    {
        case 0x00:
            colpix2 = 0x0;
            break;
        case 0x01:
            colpix2 = 0x1;
            break;
        case 0x04:
            colpix2 = 0x2;
            break;
        case 0x05:
            colpix2 = 0x3;
            break;
        case 0x10:
            colpix2 = 0x4;
            break;
        case 0x11:
            colpix2 = 0x5;
            break;
        case 0x14:
            colpix2 = 0x6;
            break;
        case 0x15:
            colpix2 = 0x7;
            break;
        case 0x40:
            colpix2 = 0x8;
            break;
        case 0x41:
            colpix2 = 0x9;
            break;
        case 0x44:
            colpix2 = 0xA;
            break;
        case 0x45:
            colpix2 = 0xB;
            break;
        case 0x50:
            colpix2 = 0xC;
            break;
        case 0x51:
            colpix2 = 0xD;
            break;
        case 0x54:
            colpix2 = 0xE;
            break;
        case 0x55:
            colpix2 = 0xF;
            break;
    }
    // only a twenty column mode is
    // officially supported,
    // so no need to scale output
    putpixel(x_cord + 0, virt_y_cord, colpix1);
    putpixel(x_cord + 1, virt_y_cord, colpix1);
    putpixel(x_cord + 2, virt_y_cord, colpix1);
    putpixel(x_cord + 3, virt_y_cord, colpix1);
    putpixel(x_cord + 4, virt_y_cord, colpix2);
    putpixel(x_cord + 5, virt_y_cord, colpix2);
    putpixel(x_cord + 6, virt_y_cord, colpix2);
    putpixel(x_cord + 7, virt_y_cord, colpix2);

    if (!(y_cord & 3))                          // if the y_cord was scaled,
        // fill in the pixels for the
    {                                         // original line
        virt_y_cord--;
        putpixel(x_cord + 0, virt_y_cord, colpix1);
        putpixel(x_cord + 1, virt_y_cord, colpix1);
        putpixel(x_cord + 2, virt_y_cord, colpix1);
        putpixel(x_cord + 3, virt_y_cord, colpix1);
        putpixel(x_cord + 4, virt_y_cord, colpix2);
        putpixel(x_cord + 5, virt_y_cord, colpix2);
        putpixel(x_cord + 6, virt_y_cord, colpix2);
        putpixel(x_cord + 7, virt_y_cord, colpix2);
    }
}